

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O1

CURLcode cf_ssl_peer_key_add_path(dynbuf *buf,char *name,char *path,_Bool *is_local)

{
  byte bVar1;
  CURLcode CVar2;
  char *__ptr;
  
  if (path == (char *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    bVar1 = *path;
    CVar2 = (CURLcode)bVar1;
    if (bVar1 != 0) {
      if (bVar1 != 0x2f) {
        __ptr = realpath(path,(char *)0x0);
        if (__ptr != (char *)0x0) {
          CVar2 = Curl_dyn_addf(buf,":%s-%s",name,__ptr);
          free(__ptr);
          return CVar2;
        }
        *is_local = true;
      }
      CVar2 = Curl_dyn_addf(buf,":%s-%s",name,path);
      return CVar2;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode cf_ssl_peer_key_add_path(struct dynbuf *buf,
                                          const char *name,
                                          char *path,
                                          bool *is_local)
{
  if(path && path[0]) {
    /* We try to add absolute paths, so that the session key can stay
     * valid when used in another process with different CWD. However,
     * when a path does not exist, this does not work. Then, we add
     * the path as is. */
#ifdef UNDER_CE
    (void)is_local;
    return Curl_dyn_addf(buf, ":%s-%s", name, path);
#elif defined(_WIN32)
    char abspath[_MAX_PATH];
    if(_fullpath(abspath, path, _MAX_PATH))
      return Curl_dyn_addf(buf, ":%s-%s", name, abspath);
    *is_local = TRUE;
#elif defined(HAVE_REALPATH)
    if(path[0] != '/') {
      char *abspath = realpath(path, NULL);
      if(abspath) {
        CURLcode r = Curl_dyn_addf(buf, ":%s-%s", name, abspath);
        (free)(abspath); /* allocated by libc, free without memdebug */
        return r;
      }
      *is_local = TRUE;
    }
#endif
    return Curl_dyn_addf(buf, ":%s-%s", name, path);
  }
  return CURLE_OK;
}